

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O2

int mbedtls_x509write_csr_set_ns_cert_type(mbedtls_x509write_csr *ctx,uchar ns_cert_type)

{
  int iVar1;
  uchar ns_cert_type_local;
  uchar buf [4];
  uchar *c;
  
  c = (uchar *)&c;
  ns_cert_type_local = ns_cert_type;
  iVar1 = mbedtls_asn1_write_bitstring(&c,buf,&ns_cert_type_local,8);
  if (iVar1 == 4) {
    iVar1 = mbedtls_x509write_csr_set_extension(ctx,anon_var_dwarf_daf,9,buf,4);
  }
  return iVar1;
}

Assistant:

int mbedtls_x509write_csr_set_ns_cert_type( mbedtls_x509write_csr *ctx,
                                    unsigned char ns_cert_type )
{
    unsigned char buf[4];
    unsigned char *c;
    int ret;

    c = buf + 4;

    if( ( ret = mbedtls_asn1_write_bitstring( &c, buf, &ns_cert_type, 8 ) ) != 4 )
        return( ret );

    ret = mbedtls_x509write_csr_set_extension( ctx, MBEDTLS_OID_NS_CERT_TYPE,
                                       MBEDTLS_OID_SIZE( MBEDTLS_OID_NS_CERT_TYPE ),
                                       buf, 4 );
    if( ret != 0 )
        return( ret );

    return( 0 );
}